

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::closeReceiver(UdpComms *this)

{
  string_view message;
  bool bVar1;
  ConnectionStatus CVar2;
  udp uVar3;
  io_context *this_00;
  char *in_RDI;
  error_code error;
  string cls;
  socket transmitter;
  query queryLocal_1;
  resolver resolver_1;
  query queryLocal;
  resolver resolver;
  endpoint rxEndpoint;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  ActionMessage cmd;
  undefined4 in_stack_fffffffffffffa58;
  constraint_t<is_convertible<io_context_&,_execution_context_&>::value> in_stack_fffffffffffffa5c;
  ActionMessage *in_stack_fffffffffffffa60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data;
  CommsInterface *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  flags resolve_flags;
  basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *this_01;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 uVar4;
  action_t in_stack_fffffffffffffa7c;
  ActionMessage *in_stack_fffffffffffffa80;
  protocol_type *in_stack_fffffffffffffa88;
  basic_resolver_query<asio::ip::udp> *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  udp in_stack_fffffffffffffa9c;
  query *in_stack_fffffffffffffaa0;
  basic_resolver<asio::ip::udp,_asio::any_io_executor> *in_stack_fffffffffffffaa8;
  CommsInterface *this_02;
  size_t in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae8;
  undefined1 local_4e8 [32];
  __sv_type local_4c8;
  mutable_buffer local_4b8;
  undefined1 local_4a8 [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_491;
  int local_470;
  basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> local_46c [2];
  int local_39c;
  format_args in_stack_fffffffffffffcc0;
  string_view in_stack_fffffffffffffcd0;
  allocator<char> local_279 [37];
  int local_254;
  undefined1 local_170 [68];
  undefined4 local_12c;
  undefined4 local_124;
  undefined1 local_68 [16];
  size_type local_58;
  undefined1 local_50 [16];
  _Alloc_hider _Stack_40;
  undefined1 local_30 [16];
  _Alloc_hider _Stack_20;
  undefined1 *local_18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10;
  
  CVar2 = CommsInterface::getTxStatus((CommsInterface *)0x48f444);
  if (CVar2 == CONNECTED) {
    ActionMessage::ActionMessage(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
    local_124 = 0x16570bf;
    local_12c = 0xffffffff;
    CommsInterface::transmit
              (in_stack_fffffffffffffa68,
               (route_id)(BaseType)((ulong)in_stack_fffffffffffffa70 >> 0x20),
               in_stack_fffffffffffffa60);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffa60);
  }
  else {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffa68);
    if (!bVar1) {
      this_02 = (CommsInterface *)local_170;
      std::__cxx11::string::string(in_stack_fffffffffffffa70);
      resolve_flags = (flags)((ulong)in_stack_fffffffffffffa70 >> 0x20);
      gmlc::networking::AsioContextManager::getContextPointer(in_stack_fffffffffffffae8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_170 + 0x20));
      if (bVar1) {
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)0x48f545);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x48f559)
        ;
        if (((bVar1) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffa60,
                                     (char *)CONCAT44(in_stack_fffffffffffffa5c,
                                                      in_stack_fffffffffffffa58)), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffa60,
                                    (char *)CONCAT44(in_stack_fffffffffffffa5c,
                                                     in_stack_fffffffffffffa58)), bVar1)) {
          std::
          __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x48f5c3);
          gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x48f5cb);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::
          basic_resolver<asio::io_context>
                    ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                     in_stack_fffffffffffffa80,
                     (io_context *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     resolve_flags);
          local_254 = (int)udpnet(LOCAL);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaa0,
                     (char *)CONCAT44(in_stack_fffffffffffffa9c.family_,in_stack_fffffffffffffa98),
                     (allocator<char> *)in_stack_fffffffffffffa90);
          std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffa68);
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                     (string *)in_stack_fffffffffffffa80,
                     (string *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     resolve_flags);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa60);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa60);
          std::allocator<char>::~allocator(local_279);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                    (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
                    ((basic_resolver_iterator<asio::ip::udp> *)0x48f6df);
          asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                    ((basic_resolver_entry<asio::ip::udp> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          asio::ip::basic_endpoint<asio::ip::udp>::operator=
                    ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffa60,
                     (basic_endpoint<asio::ip::udp> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
                    ((basic_resolver_results<asio::ip::udp> *)0x48f71c);
          asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                    ((basic_resolver_query<asio::ip::udp> *)in_stack_fffffffffffffa60);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::~basic_resolver
                    ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                     in_stack_fffffffffffffa60);
        }
        else {
          std::
          __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x48f85f);
          in_stack_fffffffffffffaa0 =
               (query *)gmlc::networking::AsioContextManager::getBaseContext
                                  ((AsioContextManager *)0x48f867);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::
          basic_resolver<asio::io_context>
                    ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                     in_stack_fffffffffffffa80,
                     (io_context *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     resolve_flags);
          in_stack_fffffffffffffa9c = udpnet(LOCAL);
          in_stack_fffffffffffffa90 = (basic_resolver_query<asio::ip::udp> *)(in_RDI + 0xf0);
          local_39c = in_stack_fffffffffffffa9c.family_;
          std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffa68);
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
          asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                     (string *)in_stack_fffffffffffffa80,
                     (string *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     resolve_flags);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa60);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                    (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
          asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
                    ((basic_resolver_iterator<asio::ip::udp> *)0x48f93f);
          asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                    ((basic_resolver_entry<asio::ip::udp> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          asio::ip::basic_endpoint<asio::ip::udp>::operator=
                    ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffa60,
                     (basic_endpoint<asio::ip::udp> *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
          asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
                    ((basic_resolver_results<asio::ip::udp> *)0x48f97c);
          asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                    ((basic_resolver_query<asio::ip::udp> *)in_stack_fffffffffffffa60);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::~basic_resolver
                    ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                     in_stack_fffffffffffffa60);
        }
        std::
        __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x48fa37);
        this_00 = gmlc::networking::AsioContextManager::getBaseContext
                            ((AsioContextManager *)0x48fa3f);
        uVar3 = udpnet(LOCAL);
        this_01 = local_46c;
        uVar4 = 0;
        local_470 = uVar3.family_;
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)this_01,(udp *)in_stack_fffffffffffffa68,
                   (port_type)((ulong)in_stack_fffffffffffffa60 >> 0x30));
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
        basic_datagram_socket<asio::io_context>
                  (this_01,(io_context *)in_stack_fffffffffffffa68,
                   (endpoint_type *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
        x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4a8 + 0x17);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffaa0,
                   (char *)CONCAT44(in_stack_fffffffffffffa9c.family_,in_stack_fffffffffffffa98),
                   (allocator<char> *)in_stack_fffffffffffffa90);
        std::allocator<char>::~allocator((allocator<char> *)(local_4a8 + 0x17));
        data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
        CLI::std::error_code::error_code((error_code *)data);
        local_4b8 = (mutable_buffer)
                    asio::buffer<char,std::char_traits<char>,std::allocator<char>>(data);
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
        send_to<asio::mutable_buffers_1>
                  ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)this_00,
                   (mutable_buffers_1 *)CONCAT44(uVar3.family_,uVar4),(endpoint_type *)this_01,
                   (message_flags)((ulong)x >> 0x20),(error_code *)data);
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_4a8);
        if (bVar1) {
          std::error_code::message_abi_cxx11_((error_code *)CONCAT44(uVar3.family_,uVar4));
          local_18 = local_4e8;
          local_30._8_8_ = "transmit failure on disconnect:{}";
          _Stack_20._M_p = (pointer)0x21;
          local_30._0_8_ = &stack0xfffffffffffffae8;
          local_50._8_8_ = "transmit failure on disconnect:{}";
          _Stack_40._M_p = (pointer)0x21;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)this_01,x);
          local_10._8_8_ = &local_58;
          local_10._M_allocated_capacity = (size_type)local_68;
          local_58 = 0xd;
          local_50._0_8_ = local_10._M_allocated_capacity;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc0);
          local_4c8 = std::__cxx11::string::operator_cast_to_basic_string_view(data);
          message._M_str = in_RDI;
          message._M_len = in_stack_fffffffffffffad8;
          CommsInterface::logWarning(this_02,message);
          std::__cxx11::string::~string(data);
          std::__cxx11::string::~string(data);
        }
        std::__cxx11::string::~string(data);
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::~basic_datagram_socket
                  ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)0x48fd49);
      }
      std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
                ((shared_ptr<gmlc::networking::AsioContextManager> *)0x48fd74);
    }
  }
  return;
}

Assistant:

void UdpComms::closeReceiver()
{
    if (getTxStatus() == ConnectionStatus::CONNECTED) {
        ActionMessage cmd(CMD_PROTOCOL);
        cmd.messageID = CLOSE_RECEIVER;
        transmit(control_route, cmd);
    } else if (!disconnecting) {
        try {
            auto serv = gmlc::networking::AsioContextManager::getContextPointer();
            if (serv) {
                udp::endpoint rxEndpoint;

                if (localTargetAddress.empty() || localTargetAddress == "*" ||
                    localTargetAddress == "udp://*") {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          "127.0.0.1",
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                } else {
                    // try connecting with the receiver socket
                    udp::resolver resolver(serv->getBaseContext());
                    const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                                          localTargetAddress,
                                                          std::to_string(PortNumber));
                    rxEndpoint = *resolver.resolve(queryLocal);
                }

                udp::socket transmitter(serv->getBaseContext(),
                                        udp::endpoint(udpnet(interfaceNetwork), 0));
                std::string cls("close");
                std::error_code error;
                transmitter.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure on disconnect:{}", error.message()));
                }
            }
        }
        // NOLINTNEXTLINE
        catch (...) {
            // ignore error here since we are already disconnecting
        }
    }
}